

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  pointer pfVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  undefined1 auVar16 [16];
  uint uVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  void *pvVar26;
  void *pvVar27;
  long lVar28;
  long lVar29;
  void *pvVar30;
  long lVar31;
  void *pvVar32;
  long lVar33;
  long lVar34;
  undefined1 in_ZMM3 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  auVar20 = _DAT_0030caa0;
  auVar19 = _DAT_0030ca80;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    iVar3 = top_blob->w;
    iVar4 = top_blob->h;
    pvVar9 = _kernel->data;
    pvVar10 = _bias->data;
    iVar5 = bottom_blob->w;
    iVar6 = top_blob->dims;
    iVar7 = top_blob->h;
    pvVar11 = top_blob->data;
    lVar31 = top_blob->cstep * top_blob->elemsize;
    iVar8 = top_blob->w;
    pfVar12 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    sVar13 = bottom_blob->cstep;
    sVar14 = bottom_blob->elemsize;
    pvVar15 = bottom_blob->data;
    lVar28 = 0;
    auVar16 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    pvVar30 = pvVar11;
    do {
      iVar22 = 1;
      if (iVar6 != 3) {
        iVar22 = top_blob->d;
      }
      if (pvVar10 == (void *)0x0) {
        auVar35 = ZEXT816(0) << 0x40;
      }
      else {
        auVar35 = ZEXT416(*(uint *)((long)pvVar10 + lVar28 * 4));
      }
      fVar1 = pfVar12[lVar28];
      uVar21 = iVar22 * iVar7 * iVar8;
      if (0 < (int)uVar21) {
        auVar37._8_8_ = 0;
        auVar37._0_8_ = (ulong)uVar21 - 1;
        auVar37 = vpshufd_avx(auVar37,0x44);
        auVar35 = vshufps_avx(auVar35,auVar35,0);
        auVar36._16_16_ = auVar35;
        auVar36._0_16_ = auVar35;
        uVar23 = auVar37._0_8_;
        auVar35._0_8_ = uVar23 ^ 0x8000000000000000;
        auVar35._8_4_ = auVar37._8_4_;
        uVar17 = auVar37._12_4_;
        auVar35._12_4_ = uVar17 ^ 0x80000000;
        auVar38._0_8_ = uVar23 ^ 0x8000000000000000;
        auVar38._8_4_ = auVar35._8_4_;
        auVar38._12_4_ = uVar17 ^ 0x80000000;
        auVar39._0_8_ = uVar23 ^ 0x8000000000000000;
        auVar39._8_4_ = auVar35._8_4_;
        auVar39._12_4_ = uVar17 ^ 0x80000000;
        uVar23 = 0;
        do {
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar23;
          auVar37 = vpshufd_avx(auVar40,0x44);
          auVar42._16_16_ = auVar37;
          auVar42._0_16_ = auVar37;
          auVar43 = vorps_avx(auVar42,auVar19);
          auVar42 = vorps_avx(auVar42,auVar20);
          auVar45._0_8_ = auVar42._16_8_ ^ 0x8000000000000000;
          auVar45._8_4_ = auVar42._24_4_;
          auVar45._12_4_ = auVar42._28_4_ ^ 0x80000000;
          auVar37 = vpcmpgtq_avx(auVar45,auVar35);
          auVar41._0_8_ = auVar42._0_8_ ^ 0x8000000000000000;
          auVar41._8_4_ = auVar42._8_4_;
          auVar41._12_4_ = auVar42._12_4_ ^ 0x80000000;
          auVar40 = vpcmpgtq_avx(auVar41,auVar38);
          auVar37 = vpackssdw_avx(auVar40,auVar37);
          auVar46._0_8_ = auVar43._16_8_ ^ 0x8000000000000000;
          auVar46._8_4_ = auVar43._24_4_;
          auVar46._12_4_ = auVar43._28_4_ ^ 0x80000000;
          auVar40 = vpcmpgtq_avx(auVar46,auVar35);
          auVar44._0_8_ = auVar43._0_8_ ^ 0x8000000000000000;
          auVar44._8_4_ = auVar43._8_4_;
          auVar44._12_4_ = auVar43._12_4_ ^ 0x80000000;
          auVar41 = vpcmpgtq_avx(auVar44,auVar39);
          auVar40 = vpackssdw_avx(auVar41,auVar40);
          auVar37 = vpackssdw_avx(auVar40 ^ auVar16,auVar37 ^ auVar16);
          auVar40 = vpmovsxwd_avx(auVar37);
          auVar37 = vpunpckhwd_avx(auVar37,auVar37);
          auVar43._16_16_ = auVar37;
          auVar43._0_16_ = auVar40;
          auVar43 = vmaskmovps_avx(auVar43,auVar36);
          *(undefined1 (*) [32])((long)pvVar30 + uVar23 * 4) = auVar43;
          uVar23 = uVar23 + 8;
        } while ((uVar21 + 7 & 0xfffffff8) != uVar23);
      }
      if (0 < iVar4) {
        pvVar32 = (void *)(lVar31 * lVar28 + (long)pvVar11);
        lVar18 = lVar28 * 9;
        pvVar26 = (void *)(sVar13 * sVar14 * lVar28 + (long)pvVar15);
        pvVar27 = (void *)((long)iVar5 * 2 + (long)pvVar26);
        lVar29 = (long)iVar5 + (long)pvVar26;
        iVar22 = 0;
        do {
          if (0 < iVar3) {
            lVar33 = 2;
            lVar34 = 0;
            lVar24 = 0;
            iVar25 = iVar3 + 1;
            do {
              *(float *)((long)pvVar32 + lVar33 * 4 + -8) =
                   fVar1 * (float)((int)*(char *)((long)pvVar9 + lVar18 + 8) *
                                   (int)*(char *)((long)pvVar27 + lVar33) +
                                   (int)*(char *)((long)pvVar9 + lVar18 + 7) *
                                   (int)*(char *)((long)pvVar27 + lVar33 + -1) +
                                  (int)*(char *)((long)pvVar9 + lVar18 + 6) *
                                  (int)*(char *)((long)pvVar27 + lVar33 + -2) +
                                  (int)*(char *)((long)pvVar9 + lVar18 + 5) *
                                  (int)*(char *)(lVar29 + lVar33) +
                                  (int)*(char *)((long)pvVar9 + lVar18 + 4) *
                                  (int)*(char *)(lVar29 + -1 + lVar33) +
                                  (int)*(char *)((long)pvVar9 + lVar18 + 3) *
                                  (int)*(char *)(lVar29 + -2 + lVar33) +
                                  (int)*(char *)((long)pvVar9 + lVar18 + 2) *
                                  (int)*(char *)((long)pvVar26 + lVar33) +
                                  (int)*(char *)((long)pvVar9 + lVar18 + 1) *
                                  (int)*(char *)((long)pvVar26 + lVar33 + -1) +
                                  (int)*(char *)((long)pvVar9 + lVar18) *
                                  (int)*(char *)((long)pvVar26 + lVar33 + -2)) +
                   *(float *)((long)pvVar32 + lVar33 * 4 + -8);
              iVar25 = iVar25 + -1;
              lVar24 = lVar24 + -1;
              lVar33 = lVar33 + 1;
              lVar34 = lVar34 + -4;
            } while (1 < iVar25);
            pvVar27 = (void *)((long)pvVar27 - lVar24);
            lVar29 = lVar29 - lVar24;
            pvVar26 = (void *)((long)pvVar26 - lVar24);
            pvVar32 = (void *)((long)pvVar32 - lVar34);
          }
          pvVar26 = (void *)((long)pvVar26 + 2);
          lVar29 = lVar29 + 2;
          pvVar27 = (void *)((long)pvVar27 + 2);
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar4);
      }
      lVar28 = lVar28 + 1;
      pvVar30 = (void *)((long)pvVar30 + lVar31);
    } while (lVar28 != iVar2);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}